

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringFunctions.cpp
# Opt level: O1

string * IO::fileToString(string *__return_storage_ptr__,string *fileName)

{
  string fileInString;
  ifstream fin;
  string local_238;
  long local_218 [29];
  undefined8 auStack_130 [36];
  
  std::ifstream::ifstream(local_218,(fileName->_M_dataplus)._M_p,_S_in);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((string *)&local_238,
             *(undefined8 *)((long)auStack_130 + *(long *)(local_218[0] + -0x18)),0xffffffff,0,
             0xffffffff);
  convertToCaps(__return_storage_ptr__,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  std::ifstream::~ifstream(local_218);
  return __return_storage_ptr__;
}

Assistant:

string
IO::fileToString(const string& fileName)
{
    ifstream fin(fileName.c_str(), ios::in);

    string fileInString((istreambuf_iterator<char>(fin)),
                         istreambuf_iterator<char>());

    return convertToCaps(fileInString);
}